

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O2

void __thiscall
iu_Matcher_x_iutest_x_ElementsAreArrayForward_Test::Body
          (iu_Matcher_x_iutest_x_ElementsAreArrayForward_Test *this)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RCX;
  int (*in_RDX) [10];
  vector<int,_std::allocator<int>_> *v;
  int (*v_00) [3];
  vector<int,_std::allocator<int>_> *container;
  vector<int,_std::allocator<int>_> *v_01;
  AssertionResult *in_R8;
  initializer_list<int> l;
  string local_230;
  string local_210;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c8;
  undefined1 local_198 [392];
  
  iutest::matchers::ElementsAreArrayForward<int,10ul>
            ((ElementsAreArrayMatcher<int> *)local_198,(matchers *)(anonymous_namespace)::ga,in_RDX)
  ;
  iutest::detail::ElementsAreArrayMatcher<int>::operator()
            (&iutest_ar,(ElementsAreArrayMatcher<int> *)local_198,
             (vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::va);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)(local_198 + 8));
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    iutest::PrintToString<std::vector<int,std::allocator<int>>>
              (&local_230,(iutest *)&(anonymous_namespace)::va,v);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_210,(detail *)local_230._M_dataplus._M_p,"ElementsAreArrayForward(ga)",
               (char *)&iutest_ar,in_R8);
    in_RCX._M_current = (int *)local_210._M_dataplus._M_p;
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x2e1,local_210._M_dataplus._M_p);
    local_1c8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,(Fixed *)local_198);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::matchers::ElementsAreArrayForward<int,3ul>
            ((ElementsAreArrayMatcher<int> *)local_198,(matchers *)(anonymous_namespace)::gc,v_00);
  iutest::detail::ElementsAreArrayMatcher<int>::operator()
            (&iutest_ar,(ElementsAreArrayMatcher<int> *)local_198,
             (int (*) [3])(anonymous_namespace)::gc);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)(local_198 + 8));
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    iutest::PrintToString<int[3]>(&local_230,(int (*) [3])(anonymous_namespace)::gc);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_210,(detail *)local_230._M_dataplus._M_p,"ElementsAreArrayForward(gc)",
               (char *)&iutest_ar,in_R8);
    in_RCX._M_current = (int *)local_210._M_dataplus._M_p;
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x2e2,local_210._M_dataplus._M_p);
    local_1c8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,(Fixed *)local_198);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::matchers::
  ElementsAreArrayForward<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((ElementsAreArrayMatcher<int> *)local_198,(anonymous_namespace)::va,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             ((anonymous_namespace)::va + 4),in_RCX);
  iutest::detail::ElementsAreArrayMatcher<int>::operator()
            (&iutest_ar,(ElementsAreArrayMatcher<int> *)local_198,
             (int (*) [10])(anonymous_namespace)::ga);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)(local_198 + 8));
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    iutest::PrintToString<int[10]>(&local_230,(int (*) [10])(anonymous_namespace)::ga);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_210,(detail *)local_230._M_dataplus._M_p,
               "ElementsAreArrayForward(va.begin(), va.begin()+1)",(char *)&iutest_ar,in_R8);
    in_RCX._M_current = (int *)local_210._M_dataplus._M_p;
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x2e3,local_210._M_dataplus._M_p);
    local_1c8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,(Fixed *)local_198);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::matchers::ElementsAreArrayForward<std::vector<int,std::allocator<int>>>
            ((ElementsAreArrayMatcher<int> *)local_198,(matchers *)&(anonymous_namespace)::va,
             container);
  iutest::detail::ElementsAreArrayMatcher<int>::operator()
            (&iutest_ar,(ElementsAreArrayMatcher<int> *)local_198,
             (vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::va);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)(local_198 + 8));
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    iutest::PrintToString<std::vector<int,std::allocator<int>>>
              (&local_230,(iutest *)&(anonymous_namespace)::va,v_01);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_210,(detail *)local_230._M_dataplus._M_p,"ElementsAreArrayForward(va)",
               (char *)&iutest_ar,in_R8);
    in_RCX._M_current = (int *)local_210._M_dataplus._M_p;
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x2e4,local_210._M_dataplus._M_p);
    local_1c8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,(Fixed *)local_198);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_1c8.m_message._M_dataplus._M_p = (pointer)0x100000001;
  l._M_len = (size_type)in_RCX._M_current;
  l._M_array = (iterator)0x2;
  iutest::matchers::ElementsAreArrayForward<int>
            ((ElementsAreArrayMatcher<int> *)local_198,(matchers *)&local_1c8,l);
  iutest::detail::ElementsAreArrayMatcher<int>::operator()
            (&iutest_ar,(ElementsAreArrayMatcher<int> *)local_198,
             (int (*) [3])(anonymous_namespace)::gc);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)(local_198 + 8));
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    iutest::PrintToString<int[3]>(&local_230,(int (*) [3])(anonymous_namespace)::gc);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_210,(detail *)local_230._M_dataplus._M_p,"ElementsAreArrayForward({1, 1})",
               (char *)&iutest_ar,in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x2e6,local_210._M_dataplus._M_p);
    local_1c8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,(Fixed *)local_198);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::matchers::ElementsAreArrayForward<int>
            ((ElementsAreArrayMatcher<int> *)local_198,(int *)(anonymous_namespace)::gb,1);
  iutest::detail::ElementsAreArrayMatcher<int>::operator()
            (&iutest_ar,(ElementsAreArrayMatcher<int> *)local_198,
             (int (*) [3])(anonymous_namespace)::gc);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)(local_198 + 8));
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    iutest::PrintToString<int[3]>(&local_230,(int (*) [3])(anonymous_namespace)::gc);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_210,(detail *)local_230._M_dataplus._M_p,"ElementsAreArrayForward(gb, 1)",
               (char *)&iutest_ar,in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x2e8,local_210._M_dataplus._M_p);
    local_1c8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,(Fixed *)local_198);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(Matcher, ElementsAreArrayForward)
{
    IUTEST_EXPECT_THAT(va, ElementsAreArrayForward(ga));
    IUTEST_EXPECT_THAT(gc, ElementsAreArrayForward(gc));
    IUTEST_EXPECT_THAT(ga, ElementsAreArrayForward(va.begin(), va.begin()+1));
    IUTEST_EXPECT_THAT(va, ElementsAreArrayForward(va));
#if IUTEST_HAS_INITIALIZER_LIST
    IUTEST_EXPECT_THAT(gc, ElementsAreArrayForward({1, 1}));
#endif
    IUTEST_EXPECT_THAT(gc, ElementsAreArrayForward(gb, 1));
}